

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

void directories::MADPCreateResultsDir(string *method,PlanningUnit *pu)

{
  MultiAgentDecisionProcessInterface *pMVar1;
  PlanningUnit *in_RSI;
  string *in_stack_00000288;
  string *in_stack_00000290;
  string local_30 [48];
  
  pMVar1 = PlanningUnit::GetProblem(in_RSI);
  (*pMVar1->_vptr_MultiAgentDecisionProcessInterface[4])();
  MADPCreateResultsDir(in_stack_00000290,in_stack_00000288);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void directories::MADPCreateResultsDir(const string & method,
                                      const PlanningUnit *pu)
{
    return(MADPCreateResultsDir(method,pu->GetProblem()->GetUnixName()));
}